

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O3

ssize_t wrapped_write(int fd,void *buf,size_t count)

{
  int *piVar1;
  long lVar2;
  code *UNRECOVERED_JUMPTABLE;
  curious_file_record_t *pcVar3;
  ssize_t sVar4;
  ssize_t local_58;
  undefined4 local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  lVar2 = __tls_get_addr(&PTR_00279768);
  piVar1 = (int *)(lVar2 + 0xc);
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (code *)gotcha_get_wrappee(io_fns[1].handle);
  if ((*piVar1 == 1) && (wrappers_enabled != 0)) {
    pcVar3 = get_curious_file_record(fd);
    if (pcVar3 == (curious_file_record_t *)0x0) {
      local_48 = 0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
    }
    else {
      local_48 = *(undefined4 *)&pcVar3->filesystem;
      uStack_44 = *(undefined4 *)((long)&pcVar3->filesystem + 4);
      uStack_40 = *(undefined4 *)&pcVar3->mount_point;
      uStack_3c = *(undefined4 *)((long)&pcVar3->mount_point + 4);
    }
    local_58 = 0;
    local_50 = 0;
    local_38 = 1;
    curious_call_callbacks(2,&local_58);
    local_58 = (*UNRECOVERED_JUMPTABLE)(fd,buf,count);
    local_50 = 1;
    curious_call_callbacks(3,&local_58);
    *piVar1 = *piVar1 + -1;
    return local_58;
  }
  *piVar1 = *piVar1 + -1;
  sVar4 = (*UNRECOVERED_JUMPTABLE)(fd,buf,count);
  return sVar4;
}

Assistant:

ssize_t wrapped_write(int fd, const void* buf, size_t count)
{
    WRAPPER_ENTER(write);

    // Get the handle for the original function
    write_f orig_write = (write_f) gotcha_get_wrappee(io_fns[CURIOUS_WRITE_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(fd);
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_write_record_t io_args = {
            .bytes_written = 0,
            .call_count    = 0,
            .filesystem    = filesystem,
            .mount_point   = mount_point,
            .function_id   = CURIOUS_WRITE_ID,
        };
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK, &io_args);

        // Call the original, saving the result...
        io_args.bytes_written = orig_write(fd, buf, count);
        io_args.call_count    = 1;

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(io_args.bytes_written, write);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_write(fd, buf, count), write);
    }
}